

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrLDA0xb5(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = zeropage_x_addr(this);
  this->A = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010eb41;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010eb41:
  this->field_0x2e = bVar2;
  return 4;
}

Assistant:

int CPU::instrLDA0xb5() {
	LDA(zeropage_x_addr());
	return 4;
}